

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_util.cc
# Opt level: O0

void benchmark::ToExponentAndMantissa
               (double val,double thresh,int precision,double one_k,string *mantissa,
               int64_t *exponent)

{
  double *pdVar1;
  ulong *in_RDX;
  string *in_RSI;
  double in_XMM0_Qa;
  __type _Var2;
  double in_XMM2_Qa;
  size_t i_1;
  double scaled_1;
  size_t i;
  double scaled;
  double small_threshold;
  double big_threshold;
  double adjusted_threshold;
  stringstream mantissa_stream;
  int in_stack_fffffffffffffd7c;
  double in_stack_fffffffffffffd80;
  string local_270 [32];
  string local_250 [32];
  ulong local_230;
  double local_228;
  undefined4 local_21c;
  string local_218 [32];
  ulong local_1f8;
  double local_1f0;
  double local_1e8;
  double local_1e0;
  double local_1d8;
  double local_1d0;
  stringstream local_1b8 [16];
  ostream local_1a8 [376];
  ulong *local_30;
  string *local_28;
  double local_20;
  double local_10;
  double local_8;
  
  local_30 = in_RDX;
  local_28 = in_RSI;
  local_20 = in_XMM2_Qa;
  local_8 = in_XMM0_Qa;
  std::__cxx11::stringstream::stringstream(local_1b8);
  if (local_8 < 0.0) {
    std::operator<<(local_1a8,"-");
    local_8 = -local_8;
  }
  _Var2 = std::pow<double,int>(in_stack_fffffffffffffd80,in_stack_fffffffffffffd7c);
  local_1d8 = 1.0 / _Var2;
  pdVar1 = std::max<double>(&local_10,&local_1d8);
  local_1e8 = *pdVar1;
  local_1e0 = local_1e8 * local_20;
  local_1d0 = local_1e8;
  if (local_8 <= local_1e0) {
    if (local_1e8 <= local_8) {
      std::ostream::operator<<(local_1a8,local_8);
      *local_30 = 0;
    }
    else {
      local_228 = local_8;
      for (local_230 = 0; local_230 < 9; local_230 = local_230 + 1) {
        local_228 = local_20 * local_228;
        if (local_1e8 <= local_228) {
          std::ostream::operator<<(local_1a8,local_228);
          *local_30 = ~local_230;
          std::__cxx11::stringstream::str();
          std::__cxx11::string::operator=(local_28,local_250);
          std::__cxx11::string::~string(local_250);
          local_21c = 1;
          goto LAB_0017cca5;
        }
      }
      std::ostream::operator<<(local_1a8,local_8);
      *local_30 = 0;
    }
  }
  else {
    local_1f0 = local_8;
    for (local_1f8 = 0; local_1f8 < 9; local_1f8 = local_1f8 + 1) {
      local_1f0 = local_1f0 / local_20;
      if (local_1f0 <= local_1e0) {
        std::ostream::operator<<(local_1a8,local_1f0);
        *local_30 = local_1f8 + 1;
        std::__cxx11::stringstream::str();
        std::__cxx11::string::operator=(local_28,local_218);
        std::__cxx11::string::~string(local_218);
        local_21c = 1;
        goto LAB_0017cca5;
      }
    }
    std::ostream::operator<<(local_1a8,local_8);
    *local_30 = 0;
  }
  std::__cxx11::stringstream::str();
  std::__cxx11::string::operator=(local_28,local_270);
  std::__cxx11::string::~string(local_270);
  local_21c = 0;
LAB_0017cca5:
  std::__cxx11::stringstream::~stringstream(local_1b8);
  return;
}

Assistant:

void ToExponentAndMantissa(double val, double thresh, int precision,
                           double one_k, std::string* mantissa,
                           int64_t* exponent) {
  std::stringstream mantissa_stream;

  if (val < 0) {
    mantissa_stream << "-";
    val = -val;
  }

  // Adjust threshold so that it never excludes things which can't be rendered
  // in 'precision' digits.
  const double adjusted_threshold =
      std::max(thresh, 1.0 / std::pow(10.0, precision));
  const double big_threshold = adjusted_threshold * one_k;
  const double small_threshold = adjusted_threshold;

  if (val > big_threshold) {
    // Positive powers
    double scaled = val;
    for (size_t i = 0; i < arraysize(kBigSIUnits); ++i) {
      scaled /= one_k;
      if (scaled <= big_threshold) {
        mantissa_stream << scaled;
        *exponent = i + 1;
        *mantissa = mantissa_stream.str();
        return;
      }
    }
    mantissa_stream << val;
    *exponent = 0;
  } else if (val < small_threshold) {
    // Negative powers
    double scaled = val;
    for (size_t i = 0; i < arraysize(kSmallSIUnits); ++i) {
      scaled *= one_k;
      if (scaled >= small_threshold) {
        mantissa_stream << scaled;
        *exponent = -static_cast<int64_t>(i + 1);
        *mantissa = mantissa_stream.str();
        return;
      }
    }
    mantissa_stream << val;
    *exponent = 0;
  } else {
    mantissa_stream << val;
    *exponent = 0;
  }
  *mantissa = mantissa_stream.str();
}